

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportBuildFileGenerator::cmExportBuildFileGenerator(cmExportBuildFileGenerator *this)

{
  Snapshot local_38;
  
  cmExportFileGenerator::cmExportFileGenerator(&this->super_cmExportFileGenerator);
  (this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator =
       (_func_int **)&PTR__cmExportBuildFileGenerator_006c1848;
  (this->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Exports).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Exports).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Exports).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmState::Snapshot::Snapshot(&local_38,(cmState *)0x0,(PositionType)ZEXT816(0));
  (this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Backtrace).Snapshot.State = local_38.State;
  (this->Backtrace).Snapshot.Position.Tree = local_38.Position.Tree;
  (this->Backtrace).Snapshot.Position.Position = local_38.Position.Position;
  this->Makefile = (cmMakefile *)0x0;
  this->ExportSet = (cmExportSet *)0x0;
  return;
}

Assistant:

cmExportBuildFileGenerator::cmExportBuildFileGenerator()
  : Backtrace()
{
  this->Makefile = 0;
  this->ExportSet = 0;
}